

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Instr * __thiscall IR::Instr::GetNextByteCodeInstr(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  uint32 uVar4;
  uint32 uVar5;
  Instr *this_00;
  undefined4 *puVar6;
  
  this_00 = GetNextRealInstrOrLabel(this);
  uVar4 = GetByteCodeOffset(this);
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while ((uVar5 = GetByteCodeOffset(this_00), uVar5 == 0xffffffff ||
         (uVar5 = GetByteCodeOffset(this_00), uVar5 == uVar4))) {
    if (this_00->m_kind == InstrKindBranch) {
      OVar3 = this_00->m_opcode;
      if (OVar3 < ADD) {
        if ((OVar3 != Br) && (OVar3 != MultiBr)) goto LAB_004b8442;
LAB_004b8496:
        if ((OVar3 != MultiBr) && (OVar3 != Br)) goto LAB_004b84ae;
      }
      else {
        bVar2 = LowererMD::IsUnconditionalBranch(this_00);
        if (!bVar2) {
LAB_004b8442:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                             ,0xb0c,"(branchInstr->IsUnconditional())",
                             "We can\'t know which branch to take on a conditionnal branch");
          if (!bVar2) goto LAB_004b85fc;
          *puVar6 = 0;
        }
        OVar3 = this_00->m_opcode;
        if (OVar3 < ADD) goto LAB_004b8496;
        bVar2 = LowererMD::IsUnconditionalBranch(this_00);
        if (!bVar2) goto LAB_004b84ae;
      }
      this_00 = this_00[1].m_next;
    }
    else {
LAB_004b84ae:
      this_00 = GetNextRealInstrOrLabel(this_00);
    }
  }
  if (uVar4 == 0xffffffff) {
    uVar4 = GetByteCodeOffset(this_00);
    if (uVar4 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xb27,"(nextInstr->GetByteCodeOffset() == 0)",
                         "Only instrs before the first one are allowed to not have a bytecode offset"
                        );
      if (!bVar2) {
LAB_004b85fc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  else {
    while ((uVar5 = GetByteCodeOffset(this_00), uVar5 == 0xffffffff ||
           (uVar5 = GetByteCodeOffset(this_00), uVar5 < uVar4))) {
      if (this_00->m_kind == InstrKindBranch) {
        OVar3 = this_00->m_opcode;
        if (OVar3 < ADD) {
          if ((OVar3 != Br) && (OVar3 != MultiBr)) goto LAB_004b8523;
LAB_004b8577:
          if ((OVar3 != MultiBr) && (OVar3 != Br)) goto LAB_004b858f;
        }
        else {
          bVar2 = LowererMD::IsUnconditionalBranch(this_00);
          if (!bVar2) {
LAB_004b8523:
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                               ,0xb0c,"(branchInstr->IsUnconditional())",
                               "We can\'t know which branch to take on a conditionnal branch");
            if (!bVar2) goto LAB_004b85fc;
            *puVar6 = 0;
          }
          OVar3 = this_00->m_opcode;
          if (OVar3 < ADD) goto LAB_004b8577;
          bVar2 = LowererMD::IsUnconditionalBranch(this_00);
          if (!bVar2) goto LAB_004b858f;
        }
        this_00 = this_00[1].m_next;
      }
      else {
LAB_004b858f:
        this_00 = GetNextRealInstrOrLabel(this_00);
      }
    }
  }
  return this_00;
}

Assistant:

IR::Instr *
Instr::GetNextByteCodeInstr() const
{
    IR::Instr * nextInstr = GetNextRealInstrOrLabel();
    uint32 currentOffset = GetByteCodeOffset();
    const auto getNext = [](IR::Instr* nextInstr) -> IR::Instr*
    {
        if (nextInstr->IsBranchInstr())
        {
            IR::BranchInstr* branchInstr = nextInstr->AsBranchInstr();
            AssertMsg(branchInstr->IsUnconditional(), "We can't know which branch to take on a conditionnal branch");
            if (branchInstr->IsUnconditional())
            {
                return branchInstr->GetTarget();
            }
        }
        return nextInstr->GetNextRealInstrOrLabel();
    };
    while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
        nextInstr->GetByteCodeOffset() == currentOffset)
    {
        nextInstr = getNext(nextInstr);
    }

    // Do not check if the instr trying to bailout is in the function prologue
    // nextInstr->GetByteCodeOffset() < currentOffset would always be true and we would crash
    if (currentOffset != Js::Constants::NoByteCodeOffset)
    {
        // This can happen due to break block removal
        while (nextInstr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset ||
            nextInstr->GetByteCodeOffset() < currentOffset)
        {
            nextInstr = getNext(nextInstr);
        }
    }
    else
    {
        AssertMsg(nextInstr->GetByteCodeOffset() == 0, "Only instrs before the first one are allowed to not have a bytecode offset");
    }
    return nextInstr;
}